

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

size_type find(string *text,string *pattern,size_type begin,bool sensitive)

{
  pointer pcVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  size_type sVar7;
  undefined7 in_register_00000009;
  pointer pcVar8;
  char *p;
  size_t len;
  
  pcVar1 = (pattern->_M_dataplus)._M_p;
  sVar6 = pattern->_M_string_length;
  if ((int)CONCAT71(in_register_00000009,sensitive) != 0) {
    sVar6 = std::__cxx11::string::find((char *)text,(ulong)pcVar1,begin);
    return sVar6;
  }
  if (sVar6 == 0) {
    sVar7 = 0;
  }
  else {
    uVar2 = text->_M_string_length;
    sVar7 = 0xffffffffffffffff;
    if (begin < uVar2) {
      pcVar3 = (text->_M_dataplus)._M_p;
      pcVar8 = pcVar3 + begin;
      if (pcVar8 <= pcVar3 + (uVar2 - sVar6)) {
        do {
          sVar7 = 0;
          while( true ) {
            iVar4 = tolower((int)pcVar8[sVar7]);
            iVar5 = tolower((int)pcVar1[sVar7]);
            if (iVar4 != iVar5) break;
            sVar7 = sVar7 + 1;
            if (sVar6 == sVar7) {
              return (long)pcVar8 - (long)pcVar3;
            }
          }
          pcVar8 = pcVar8 + 1;
        } while (pcVar8 <= pcVar3 + (uVar2 - sVar6));
        sVar7 = 0xffffffffffffffff;
      }
    }
  }
  return sVar7;
}

Assistant:

std::string::size_type find (
  const std::string& text,
  const std::string& pattern,
  std::string::size_type begin,
  bool sensitive)
{
  // Implement a sensitive find, which is really just a loop withing a loop,
  // comparing lower-case versions of each character in turn.
  if (!sensitive)
  {
    // Handle empty pattern.
    const char* p = pattern.c_str ();
    size_t len = pattern.length ();
    if (len == 0)
      return 0;

    // Handle bad begin.
    if (begin >= text.length ())
      return std::string::npos;

    // Evaluate these once, for performance reasons.
    const char* start = text.c_str ();
    const char* t = start + begin;
    const char* end = start + text.size ();

    for (; t <= end - len; ++t)
    {
      int diff = 0;
      for (size_t i = 0; i < len; ++i)
        if ((diff = tolower (t[i]) - tolower (p[i])))
          break;

      // diff == 0 means there was no break from the loop, which only occurs
      // when a difference is detected.  Therefore, the loop terminated, and
      // diff is zero.
      if (diff == 0)
        return t - start;
    }

    return std::string::npos;
  }

  // Otherwise, just use std::string::find.
  return text.find (pattern, begin);
}